

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O3

aiString * Read<aiString>(aiString *__return_storage_ptr__,IOStream *stream)

{
  uint uVar1;
  
  __return_storage_ptr__->length = 0;
  __return_storage_ptr__->data[0] = '\0';
  memset(__return_storage_ptr__->data + 1,0x1b,0x3ff);
  (*stream->_vptr_IOStream[2])(stream,__return_storage_ptr__,4,1);
  if ((ulong)__return_storage_ptr__->length == 0) {
    uVar1 = 0;
  }
  else {
    (*stream->_vptr_IOStream[2])
              (stream,__return_storage_ptr__->data,(ulong)__return_storage_ptr__->length,1);
    uVar1 = __return_storage_ptr__->length;
  }
  __return_storage_ptr__->data[uVar1] = '\0';
  return __return_storage_ptr__;
}

Assistant:

aiString Read<aiString>(IOStream * stream) {
    aiString s;
    stream->Read(&s.length,4,1);
    if(s.length)
        stream->Read(s.data,s.length,1);
    s.data[s.length] = 0;
    return s;
}